

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

void rpn_HIGH(Expression *expr,Expression *src)

{
  char *pcVar1;
  bool bVar2;
  undefined6 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  int32_t iVar8;
  undefined4 uVar9;
  uint8_t *puVar10;
  
  iVar8 = src->val;
  uVar9 = *(undefined4 *)&src->field_0x4;
  pcVar1 = src->reason;
  bVar2 = src->isSymbol;
  uVar3 = *(undefined6 *)&src->field_0x12;
  puVar10 = src->rpn;
  uVar4 = src->rpnCapacity;
  uVar5 = src->rpnLength;
  uVar6 = src->rpnPatchSize;
  uVar7 = *(undefined4 *)&src->field_0x2c;
  expr->isKnown = src->isKnown;
  expr->isSymbol = bVar2;
  *(undefined6 *)&expr->field_0x12 = uVar3;
  expr->rpn = puVar10;
  expr->rpnCapacity = uVar4;
  expr->rpnLength = uVar5;
  expr->rpnPatchSize = uVar6;
  *(undefined4 *)&expr->field_0x2c = uVar7;
  expr->val = iVar8;
  *(undefined4 *)&expr->field_0x4 = uVar9;
  expr->reason = pcVar1;
  expr->isSymbol = false;
  if (expr->isKnown == true) {
    expr->val = (uint)*(byte *)((long)&expr->val + 1);
    return;
  }
  expr->rpnPatchSize = expr->rpnPatchSize + 0xc;
  puVar10 = reserveSpace(expr,0xc);
  puVar10[0] = 0x80;
  puVar10[1] = '\b';
  puVar10[2] = '\0';
  puVar10[3] = '\0';
  puVar10[4] = '\0';
  puVar10[5] = 'A';
  puVar10[6] = 0x80;
  puVar10[7] = 0xff;
  puVar10[8] = '\0';
  puVar10[9] = '\0';
  puVar10[10] = '\0';
  puVar10[0xb] = '\x11';
  return;
}

Assistant:

void rpn_HIGH(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (rpn_isKnown(expr)) {
		expr->val = (uint32_t)expr->val >> 8 & 0xFF;
	} else {
		uint8_t bytes[] = {RPN_CONST,    8, 0, 0, 0, RPN_SHR,
				   RPN_CONST, 0xFF, 0, 0, 0, RPN_AND};
		expr->rpnPatchSize += sizeof(bytes);
		memcpy(reserveSpace(expr, sizeof(bytes)), bytes, sizeof(bytes));
	}
}